

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O1

void sel_move_selective_undo_proc(Am_Object *command_obj)

{
  Am_Object local_30;
  Am_Value local_28;
  Am_Value local_18;
  
  Am_Object::Am_Object(&local_30,command_obj);
  Am_Value::Am_Value(&local_18,&Am_No_Value);
  Am_Value::Am_Value(&local_28,&Am_No_Value);
  sel_move_grow_general_undo_redo(&local_30,true,true,false,&local_18,&local_28);
  Am_Value::~Am_Value(&local_28);
  Am_Value::~Am_Value(&local_18);
  Am_Object::~Am_Object(&local_30);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, sel_move_selective_undo,
                 (Am_Object command_obj))
{
  sel_move_grow_general_undo_redo(command_obj, true, true, false);
}